

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_set_feat(gauden_t *g,uint32 n_feat,uint32 *veclen)

{
  uint32 *puVar1;
  uint local_24;
  uint32 i;
  uint32 *veclen_local;
  uint32 n_feat_local;
  gauden_t *g_local;
  
  g->n_feat = n_feat;
  puVar1 = (uint32 *)
           __ckd_calloc__((ulong)n_feat,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x95);
  g->veclen = puVar1;
  memcpy(g->veclen,veclen,(ulong)n_feat << 2);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x98,"%d feature streams (",(ulong)n_feat);
  for (local_24 = 0; local_24 < n_feat; local_24 = local_24 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"|%d|=%d ",(ulong)local_24,(ulong)g->veclen[local_24]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,")\n");
  return 0;
}

Assistant:

int
gauden_set_feat(gauden_t *g,
		uint32 n_feat,
		const uint32 *veclen)
{
    uint32 i;

    g->n_feat = n_feat;
    g->veclen = ckd_calloc(n_feat, sizeof(uint32));
    memcpy(g->veclen, veclen, n_feat * sizeof(uint32));

    E_INFO("%d feature streams (", n_feat);
    for (i = 0; i < n_feat; i++) {
	E_INFOCONT("|%d|=%d ", i, g->veclen[i]);
    }
    E_INFOCONT(")\n");

    return S3_SUCCESS;
}